

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  Printer *this_00;
  size_t sVar1;
  long lVar2;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_00;
  string_view format_00;
  string_view in_stack_ffffffffffffffa0;
  
  this_00 = this->printer_;
  ToString<int,void>((string *)&stack0xffffffffffffffa0,(Formatter *)(ulong)(uint)*args,(int)args);
  ToString_abi_cxx11_(in_stack_ffffffffffffffa0);
  sVar1 = strlen(format);
  args_00.len_ = 2;
  args_00.ptr_ = (pointer)&stack0xffffffffffffffa0;
  format_00._M_str = format;
  format_00._M_len = sVar1;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,args_00,&this->vars_,format_00);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&stack0xffffffffffffffa0 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }